

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int luaV_tonumber_(TValue *obj,lua_Number *n)

{
  int iVar1;
  Value local_38;
  Value local_30;
  TValue v;
  lua_Number *n_local;
  TValue *obj_local;
  
  if (obj->tt_ == '\x03') {
    *n = (double)(obj->value_).i;
    obj_local._4_4_ = 1;
  }
  else {
    v._8_8_ = n;
    iVar1 = l_strton(obj,(TValue *)&local_30);
    if (iVar1 == 0) {
      obj_local._4_4_ = 0;
    }
    else {
      if (v.value_.ub == '\x03') {
        local_38.n = (lua_Number)local_30.i;
      }
      else {
        local_38.gc = local_30.gc;
      }
      *(Value *)v._8_8_ = local_38;
      obj_local._4_4_ = 1;
    }
  }
  return obj_local._4_4_;
}

Assistant:

int luaV_tonumber_ (const TValue *obj, lua_Number *n) {
  TValue v;
  if (ttisinteger(obj)) {
    *n = cast_num(ivalue(obj));
    return 1;
  }
  else if (l_strton(obj, &v)) {  /* string coercible to number? */
    *n = nvalue(&v);  /* convert result of 'luaO_str2num' to a float */
    return 1;
  }
  else
    return 0;  /* conversion failed */
}